

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

float ImGui::GetColumnWidth(int column_index)

{
  ImGuiOldColumns *pIVar1;
  ImGuiOldColumnData *pIVar2;
  float fVar3;
  ImVec2 IVar4;
  
  pIVar1 = (GImGui->CurrentWindow->DC).CurrentColumns;
  if (pIVar1 == (ImGuiOldColumns *)0x0) {
    IVar4 = GetContentRegionAvail();
    fVar3 = IVar4.x;
  }
  else {
    if (column_index < 0) {
      column_index = pIVar1->Current;
    }
    pIVar2 = ImVector<ImGuiOldColumnData>::operator[]
                       ((ImVector<ImGuiOldColumnData> *)&pIVar1->Columns,column_index + 1);
    fVar3 = pIVar2->OffsetNorm;
    pIVar2 = ImVector<ImGuiOldColumnData>::operator[]
                       ((ImVector<ImGuiOldColumnData> *)&pIVar1->Columns,column_index);
    fVar3 = (pIVar1->OffMaxX - pIVar1->OffMinX) * (fVar3 - pIVar2->OffsetNorm);
  }
  return fVar3;
}

Assistant:

float ImGui::GetColumnWidth(int column_index)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (columns == NULL)
        return GetContentRegionAvail().x;

    if (column_index < 0)
        column_index = columns->Current;
    return GetColumnOffsetFromNorm(columns, columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm);
}